

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitSwitch
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Switch *curr)

{
  array<wasm::Literal,_1UL> *paVar1;
  Name *pNVar2;
  ulong uVar3;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_e8;
  size_t sStack_c8;
  Name target;
  pointer local_a8;
  pointer pLStack_a0;
  pointer local_98;
  size_t local_90;
  char *pcStack_88;
  size_t sStack_78;
  Literals values;
  
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  sStack_78 = 0;
  values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  if (curr->value != (Expression *)0x0) {
    visit((Flow *)&stack0xffffffffffffff38,this,curr->value);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = sStack_c8;
    paVar1 = &(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed;
    ::wasm::Literal::operator=(paVar1->_M_elems,(Literal *)&target);
    local_e8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_98;
    local_e8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_e8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = local_a8;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = pLStack_a0;
    local_a8 = (pointer)0x0;
    pLStack_a0 = (pointer)0x0;
    local_98 = (pointer)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_e8);
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = local_90;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcStack_88;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xffffffffffffff58);
    ::wasm::Literal::~Literal((Literal *)&target);
    if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
    goto LAB_0018363b;
    sStack_78 = (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    ::wasm::Literal::operator=((Literal *)&values,paVar1->_M_elems);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type,
               &(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
  }
  visit((Flow *)&stack0xffffffffffffff38,this,curr->condition);
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = sStack_c8;
  paVar1 = &(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed;
  ::wasm::Literal::operator=(paVar1->_M_elems,(Literal *)&target);
  local_e8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_98;
  local_e8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = local_a8;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = pLStack_a0;
  local_a8 = (pointer)0x0;
  pLStack_a0 = (pointer)0x0;
  local_98 = (pointer)0x0;
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_e8);
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = local_90;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcStack_88;
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xffffffffffffff58);
  ::wasm::Literal::~Literal((Literal *)&target);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
    Flow::getSingleValue(__return_storage_ptr__);
    uVar3 = ::wasm::Literal::getInteger();
    sStack_c8 = (curr->default_).super_IString.str._M_len;
    target.super_IString.str._M_len = (size_t)(curr->default_).super_IString.str._M_str;
    if ((-1 < (long)uVar3) &&
       (uVar3 < (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                usedElements)) {
      pNVar2 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data +
               uVar3;
      sStack_c8 = (pNVar2->super_IString).str._M_len;
      target.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    }
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = sStack_c8;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)target.super_IString.str._M_len;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = sStack_78;
    ::wasm::Literal::operator=(paVar1->_M_elems,(Literal *)&values);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
              (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible,
               (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  }
LAB_0018363b:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&values);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSwitch(Switch* curr) {
    NOTE_ENTER("Switch");
    Flow flow;
    Literals values;
    if (curr->value) {
      flow = visit(curr->value);
      if (flow.breaking()) {
        return flow;
      }
      values = flow.values;
    }
    flow = visit(curr->condition);
    if (flow.breaking()) {
      return flow;
    }
    int64_t index = flow.getSingleValue().getInteger();
    Name target = curr->default_;
    if (index >= 0 && (size_t)index < curr->targets.size()) {
      target = curr->targets[(size_t)index];
    }
    flow.breakTo = target;
    flow.values = values;
    return flow;
  }